

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O2

void __thiscall
DebugUtilsData::DeleteObject(DebugUtilsData *this,uint64_t object_handle,XrObjectType object_type)

{
  XrSdkSessionLabelList *pXVar1;
  XrSession_T *session;
  uint64_t local_20;
  
  ObjectInfoCollection::RemoveObject(&this->object_info_,object_handle,object_type);
  if (object_type == XR_OBJECT_TYPE_SESSION) {
    local_20 = object_handle;
    pXVar1 = GetSessionLabelList(this,(XrSession)object_handle);
    if (pXVar1 != (XrSdkSessionLabelList *)0x0) {
      std::
      _Hashtable<XrSession_T_*,_std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>,_std::allocator<std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSession_T_*>,_std::hash<XrSession_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<XrSession_T_*,_std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>,_std::allocator<std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSession_T_*>,_std::hash<XrSession_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_20);
    }
  }
  return;
}

Assistant:

void DebugUtilsData::DeleteObject(uint64_t object_handle, XrObjectType object_type) {
    object_info_.RemoveObject(object_handle, object_type);

    if (object_type == XR_OBJECT_TYPE_SESSION) {
        auto session = TreatIntegerAsHandle<XrSession>(object_handle);
        XrSdkSessionLabelList* vec_ptr = GetSessionLabelList(session);
        if (vec_ptr != nullptr) {
            session_labels_.erase(session);
        }
    }
}